

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-event.c
# Opt level: O0

void event_signal_tunnel(game_event_type type,wchar_t nstep,wchar_t npierce,wchar_t ndug,
                        wchar_t dstart,wchar_t dend,_Bool early)

{
  undefined1 local_58 [8];
  game_event_data data;
  wchar_t local_20;
  wchar_t wStack_1c;
  _Bool early_local;
  wchar_t dend_local;
  wchar_t dstart_local;
  wchar_t ndug_local;
  wchar_t npierce_local;
  wchar_t nstep_local;
  game_event_type type_local;
  
  data.explosion.centre.y._3_1_ = early;
  data.bolt.ox._0_1_ = early;
  local_58._0_4_ = nstep;
  local_58._4_4_ = npierce;
  data.point.x = ndug;
  data.point.y = dstart;
  data.message.type = dend;
  local_20 = dend;
  wStack_1c = dstart;
  dend_local = ndug;
  dstart_local = npierce;
  ndug_local = nstep;
  npierce_local = type;
  game_event_dispatch(type,(game_event_data *)local_58);
  return;
}

Assistant:

void event_signal_tunnel(game_event_type type, int nstep, int npierce, int ndug,
		int dstart, int dend, bool early)
{
	game_event_data data;

	data.tunnel.nstep = nstep;
	data.tunnel.npierce = npierce;
	data.tunnel.ndug = ndug;
	data.tunnel.dstart = dstart;
	data.tunnel.dend = dend;
	data.tunnel.early = early;
	game_event_dispatch(type, &data);
}